

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_debug.c
# Opt level: O0

int nni_plat_errno(int errnum)

{
  int local_14;
  int i;
  int errnum_local;
  
  if (errnum == 0) {
    i = 0;
  }
  else {
    if (errnum == 0xe) {
      nni_panic("System EFAULT encountered!");
    }
    local_14 = 0;
    while (nni_plat_errnos[local_14].nng_err != 0) {
      if (errnum == nni_plat_errnos[local_14].posix_err) {
        return nni_plat_errnos[local_14].nng_err;
      }
      local_14 = local_14 + 1;
    }
    i = errnum + 0x10000000;
  }
  return i;
}

Assistant:

int
nni_plat_errno(int errnum)
{
	int i;

	if (errnum == 0) {
		return (0);
	}
	if (errnum == EFAULT) {
		nni_panic("System EFAULT encountered!");
	}
	for (i = 0; nni_plat_errnos[i].nng_err != 0; i++) {
		if (errnum == nni_plat_errnos[i].posix_err) {
			return (nni_plat_errnos[i].nng_err);
		}
	}
	// Other system errno.
	return (NNG_ESYSERR + errnum);
}